

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void fmt::v7::detail::vformat_to<char>
               (buffer<char> *buf,text_style *ts,basic_string_view<char> format_str,
               basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               args)

{
  emphasis em;
  size_t sVar1;
  ansi_color_escape<char> emphasis;
  ansi_color_escape<char> local_44;
  
  em = ts->ems;
  if (em != 0) {
    ansi_color_escape<char>::ansi_color_escape(&local_44,em);
    sVar1 = strlen(local_44.buffer);
    buffer<char>::append<char>(buf,local_44.buffer,local_44.buffer + sVar1);
  }
  if (ts->set_foreground_color == false) {
    if (ts->set_background_color == false) {
      vformat_to<char>(buf,format_str,args,(locale_ref)0x0);
      if (em == 0) {
        return;
      }
      goto LAB_00130433;
    }
LAB_001303e9:
    ansi_color_escape<char>::ansi_color_escape(&local_44,ts->background_color,"\x1b[48;2;");
    sVar1 = strlen(local_44.buffer);
    buffer<char>::append<char>(buf,local_44.buffer,local_44.buffer + sVar1);
  }
  else {
    ansi_color_escape<char>::ansi_color_escape(&local_44,ts->foreground_color,"\x1b[38;2;");
    sVar1 = strlen(local_44.buffer);
    buffer<char>::append<char>(buf,local_44.buffer,local_44.buffer + sVar1);
    if (ts->set_background_color == true) goto LAB_001303e9;
  }
  vformat_to<char>(buf,format_str,args,(locale_ref)0x0);
LAB_00130433:
  buffer<char>::append<char>(buf,"\x1b[0m",(char *)((long)&basic_data<void>::reset_color + 4));
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, const text_style& ts,
                basic_string_view<Char> format_str,
                basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    auto emphasis = detail::make_emphasis<Char>(ts.get_emphasis());
    buf.append(emphasis.begin(), emphasis.end());
  }
  if (ts.has_foreground()) {
    has_style = true;
    auto foreground = detail::make_foreground_color<Char>(ts.get_foreground());
    buf.append(foreground.begin(), foreground.end());
  }
  if (ts.has_background()) {
    has_style = true;
    auto background = detail::make_background_color<Char>(ts.get_background());
    buf.append(background.begin(), background.end());
  }
  detail::vformat_to(buf, format_str, args);
  if (has_style) detail::reset_color<Char>(buf);
}